

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamRandomAccessController_p.cpp
# Opt level: O1

void __thiscall
BamTools::Internal::BamRandomAccessController::BamRandomAccessController
          (BamRandomAccessController *this)

{
  this->m_index = (BamIndex *)0x0;
  (this->m_region).LeftRefID = -1;
  (this->m_region).LeftPosition = -1;
  (this->m_region).RightRefID = -1;
  (this->m_region).RightPosition = -1;
  this->m_hasAlignmentsInRegion = true;
  (this->m_errorString)._M_dataplus._M_p = (pointer)&(this->m_errorString).field_2;
  (this->m_errorString)._M_string_length = 0;
  (this->m_errorString).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

BamRandomAccessController::BamRandomAccessController(void)
    : m_index(0)
    , m_hasAlignmentsInRegion(true)
{ }